

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode Curl_init_do(Curl_easy *data,connectdata *conn)

{
  undefined1 *puVar1;
  uint uVar2;
  CURLcode CVar3;
  
  if (conn == (connectdata *)0x0) {
    uVar2 = *(uint *)&(data->state).field_0x7be;
  }
  else {
    puVar1 = &(conn->bits).field_0x1;
    *puVar1 = *puVar1 & 0xef;
    uVar2 = *(uint *)&(data->state).field_0x7be;
    if (((uVar2 >> 8 & 1) != 0) && ((conn->handler->flags & 0x1000) == 0)) {
      uVar2 = uVar2 & 0xfffffeff;
    }
  }
  *(uint *)&(data->state).field_0x7be = uVar2 & 0xffffefff;
  if (((data->req).field_0xd3 & 2) != 0) {
    (data->state).httpreq = '\x05';
  }
  CVar3 = Curl_req_start(&data->req,data);
  if (CVar3 == CURLE_OK) {
    Curl_speedinit(data);
    Curl_pgrsSetUploadCounter(data,0);
    Curl_pgrsSetDownloadCounter(data,0);
  }
  return CVar3;
}

Assistant:

CURLcode Curl_init_do(struct Curl_easy *data, struct connectdata *conn)
{
  /* if this is a pushed stream, we need this: */
  CURLcode result;

  if(conn) {
    conn->bits.do_more = FALSE; /* by default there is no curl_do_more() to
                                   use */
    /* if the protocol used does not support wildcards, switch it off */
    if(data->state.wildcardmatch &&
       !(conn->handler->flags & PROTOPT_WILDCARD))
      data->state.wildcardmatch = FALSE;
  }

  data->state.done = FALSE; /* *_done() is not called yet */

  if(data->req.no_body)
    /* in HTTP lingo, no body means using the HEAD request... */
    data->state.httpreq = HTTPREQ_HEAD;

  result = Curl_req_start(&data->req, data);
  if(!result) {
    Curl_speedinit(data);
    Curl_pgrsSetUploadCounter(data, 0);
    Curl_pgrsSetDownloadCounter(data, 0);
  }
  return result;
}